

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hotel.h
# Opt level: O0

void initializeHotel(Hotel *h)

{
  int local_18;
  int local_14;
  int j;
  int i;
  Hotel *h_local;
  
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 0x1f; local_18 = local_18 + 1) {
      h->booked_rooms[local_14][local_18] = 0;
    }
  }
  return;
}

Assistant:

void initializeHotel(Hotel* h){
    for (int i = 0; i < 12; i++) {
        for (int j = 0; j < 31; j++) {
            h->booked_rooms[i][j] = 0;
        }
    }
    return;
}